

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

int __thiscall node::backspace(node *this,int line,int index)

{
  long *plVar1;
  pointer pbVar2;
  pointer pbVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  if (index < 1) {
    if (line < 1) {
      return 0;
    }
    if (index != 0) {
      return 0;
    }
    pbVar3 = (this->inputCode).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0x11 < pbVar3[(ulong)(uint)line - 1]._M_string_length + pbVar3[(uint)line]._M_string_length)
    {
      return 0;
    }
    std::__cxx11::string::_M_append
              ((char *)(pbVar3 + (uint)line + -1),(ulong)pbVar3[(uint)line]._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&this->inputCode,
               (this->inputCode).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (uint)line);
    return 2;
  }
  pbVar2 = (this->inputCode).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = pbVar2 + line;
  uVar5 = pbVar2[line]._M_string_length;
  if (uVar5 <= (uint)index) {
    if (uVar5 != (uint)index) {
      return 1;
    }
    std::__cxx11::string::substr((ulong)&local_80,(ulong)pbVar3);
    std::__cxx11::string::operator=
              ((string *)
               ((this->inputCode).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + line),(string *)&local_80);
    if (local_80 == &local_70) {
      return 1;
    }
    operator_delete(local_80,local_70 + 1);
    return 1;
  }
  std::__cxx11::string::substr((ulong)&local_40,(ulong)pbVar3);
  std::__cxx11::string::substr
            ((ulong)&local_60,
             (ulong)((this->inputCode).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + line));
  uVar5 = 0xf;
  if (local_40 != local_30) {
    uVar5 = local_30[0];
  }
  if (uVar5 < (ulong)(local_58 + local_38)) {
    uVar5 = 0xf;
    if (local_60 != local_50) {
      uVar5 = local_50[0];
    }
    if ((ulong)(local_58 + local_38) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_0010d134;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_0010d134:
  local_80 = &local_70;
  plVar1 = puVar4 + 2;
  if ((long *)*puVar4 == plVar1) {
    local_70 = *plVar1;
    uStack_68 = puVar4[3];
  }
  else {
    local_70 = *plVar1;
    local_80 = (long *)*puVar4;
  }
  local_78 = puVar4[1];
  *puVar4 = plVar1;
  puVar4[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=
            ((string *)
             ((this->inputCode).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + line),(string *)&local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return 1;
}

Assistant:

int node::backspace(int line, int index) {
  if (index > 0) {
    if (inputCode[line].length() > index) {
      inputCode[line] = inputCode[line].substr(0, index - 1) + inputCode[line].substr(index);
    } else if (inputCode[line].length() == index) {
      inputCode[line] = inputCode[line].substr(0, index - 1);
    }
    return 1;
  } else if(line > 0 && inputCode[line - 1].length() + inputCode[line].length() <= MAX_LINE_LENGTH && index == 0) {
    inputCode[line - 1] += inputCode[line];
    inputCode.erase(inputCode.begin() + line);
    return 2;
  }
  
  return 0;
}